

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingTable.cpp
# Opt level: O2

int __thiscall EncodingTable::searchStringMatch(EncodingTable *this,wstring *str,size_t pos)

{
  pointer pTVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  pTVar1 = (this->entries).
           super__Vector_base<EncodingTable::TableEntry,_std::allocator<EncodingTable::TableEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar5 = 0xffffffff;
  uVar7 = 0;
  uVar6 = 0;
  do {
    if (uVar7 == (long)(this->entries).
                       super__Vector_base<EncodingTable::TableEntry,_std::allocator<EncodingTable::TableEntry>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1 >> 5) {
      return (int)uVar5;
    }
    uVar2 = pTVar1[uVar7].valueLen;
    if (uVar6 <= uVar2) {
      uVar8 = 0;
      while (uVar2 != uVar8) {
        if ((str->_M_string_length <= pos + uVar8) ||
           (lVar3 = pTVar1[uVar7].valuePos + uVar8, lVar4 = pos + uVar8, uVar8 = uVar8 + 1,
           (this->valueData)._M_dataplus._M_p[lVar3] != (str->_M_dataplus)._M_p[lVar4]))
        goto LAB_00132a43;
      }
      uVar5 = uVar7 & 0xffffffff;
      uVar6 = uVar2;
    }
LAB_00132a43:
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

int EncodingTable::searchStringMatch(const std::wstring& str, size_t pos)
{
	size_t longestLength = 0;
	int longestNum = -1;

	for (size_t i = 0; i < entries.size(); i++)
	{
		TableEntry& entry = entries[i];
		if (entry.valueLen < longestLength) continue;

		bool match = true;
		for (size_t k = 0; k < entry.valueLen; k++)
		{
			if (pos+k >= str.size() || valueData[entry.valuePos+k] != str[pos+k])
			{
				match = false;
				break;
			}
		}

		if (match)
		{
			longestLength = entry.valueLen;
			longestNum = (int) i;
		}
	}

	return longestNum;
}